

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void __thiscall
HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::Dump
          (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this,uint newLinePerEntry)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *this_00;
  ulong uVar4;
  uint uVar5;
  Iterator local_40;
  
  if (this->tableSize != 0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar4 = 0;
    do {
      local_40.list = this->table + uVar4;
      local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
      while( true ) {
        if ((SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
            local_40.current ==
            (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
        local_40.current =
             (((SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
              local_40.current)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
            local_40.current == local_40.list) break;
        this_00 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data(&local_40);
        Output::Print(L"%4d  =>  ",(ulong)(uint)this_00->value);
        ObjWriteGuardBucket::Dump(&this_00->element);
        uVar5 = newLinePerEntry;
        if (newLinePerEntry != 0) {
          do {
            Output::Print(L"\n");
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->tableSize);
  }
  return;
}

Assistant:

FOREACH_HASHTABLE_ENTRY(T, bucket, this)
    {

        Output::Print(_u("%4d  =>  "), bucket.value);
        ::Dump<T>(bucket.element);
        for (uint i = 0; i < newLinePerEntry; i++)
        {
            Output::Print(_u("\n"));
        }
    }